

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkDarMatch(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nDist,int fVerbose)

{
  Aig_Man_t *p0;
  Aig_Man_t *p1;
  Vec_Int_t *__ptr;
  Abc_Ntk_t *pAVar1;
  int level;
  Aig_Man_t *pManRes;
  Aig_Man_t *local_30;
  
  if (pNtk1->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                  ,0xc9a,"Abc_Ntk_t *Abc_NtkDarMatch(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
  }
  p0 = Abc_NtkToDar(pNtk1,0,1);
  level = (int)pNtk1;
  if (p0 == (Aig_Man_t *)0x0) {
LAB_002acbc0:
    pAVar1 = (Abc_Ntk_t *)0x0;
    Abc_Print(level,"Converting miter into AIG has failed.\n");
  }
  else {
    if (p0->nRegs < 1) {
      __assert_fail("Aig_ManRegNum(pMan1) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                    ,0xca2,"Abc_Ntk_t *Abc_NtkDarMatch(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
    }
    if (pNtk2 == (Abc_Ntk_t *)0x0) {
      p1 = (Aig_Man_t *)0x0;
    }
    else {
      p1 = Abc_NtkToDar(pNtk2,0,1);
      level = (int)pNtk2;
      if (p1 == (Aig_Man_t *)0x0) goto LAB_002acbc0;
      if (p1->nRegs < 1) {
        __assert_fail("Aig_ManRegNum(pMan2) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                      ,0xcac,"Abc_Ntk_t *Abc_NtkDarMatch(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
      }
    }
    __ptr = Saig_StrSimPerformMatching(p0,p1,nDist,1,&local_30);
    pAVar1 = Abc_NtkFromAigPhase(local_30);
    if (__ptr != (Vec_Int_t *)0x0) {
      if (__ptr->pArray != (int *)0x0) {
        free(__ptr->pArray);
        __ptr->pArray = (int *)0x0;
      }
      free(__ptr);
    }
    if (local_30 != (Aig_Man_t *)0x0) {
      Aig_ManStop(local_30);
    }
    Aig_ManStop(p0);
    if (p1 != (Aig_Man_t *)0x0) {
      Aig_ManStop(p1);
    }
  }
  return pAVar1;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarMatch( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nDist, int fVerbose )
{
    extern Vec_Int_t * Saig_StrSimPerformMatching( Aig_Man_t * p0, Aig_Man_t * p1, int nDist, int fVerbose, Aig_Man_t ** ppMiter );
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan1, * pMan2 = NULL, * pManRes;
    Vec_Int_t * vPairs;
    assert( Abc_NtkIsStrash(pNtk1) );
    // derive AIG manager
    pMan1 = Abc_NtkToDar( pNtk1, 0, 1 );
    if ( pMan1 == NULL )
    {
        Abc_Print( 1, "Converting miter into AIG has failed.\n" );
        return NULL;
    }
    assert( Aig_ManRegNum(pMan1) > 0 );
    // derive AIG manager
    if ( pNtk2 )
    {
        pMan2 = Abc_NtkToDar( pNtk2, 0, 1 );
        if ( pMan2 == NULL )
        {
            Abc_Print( 1, "Converting miter into AIG has failed.\n" );
            return NULL;
        }
        assert( Aig_ManRegNum(pMan2) > 0 );
    }

    // perform verification
    vPairs = Saig_StrSimPerformMatching( pMan1, pMan2, nDist, 1, &pManRes );
    pNtkAig = Abc_NtkFromAigPhase( pManRes );
    if ( vPairs )
        Vec_IntFree( vPairs );
    if ( pManRes )
        Aig_ManStop( pManRes );
    Aig_ManStop( pMan1 );
    if ( pMan2 )
        Aig_ManStop( pMan2 );
    return pNtkAig;
}